

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O1

int vrna_E_ext_loop(vrna_fold_compound_t *fc,int i,int j)

{
  ushort uVar1;
  ushort uVar2;
  short *psVar3;
  int *piVar4;
  char *ptype;
  vrna_hc_t *pvVar5;
  vrna_param_t *pvVar6;
  vrna_sc_t *pvVar7;
  char cVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  code *pcVar12;
  int *piVar13;
  code *pcVar14;
  int iVar15;
  default_data hc_dat_local;
  uint local_68 [2];
  uchar *local_60;
  uint *local_50;
  int *local_48;
  void *local_40;
  vrna_callback_hc_evaluate *local_38;
  
  psVar3 = (fc->field_23).field_0.sequence_encoding;
  piVar4 = fc->jindx;
  ptype = (fc->field_23).field_0.ptype;
  pvVar5 = fc->hc;
  pvVar6 = fc->params;
  pvVar7 = (fc->field_23).field_0.sc;
  local_60 = (pvVar5->field_3).field_0.mx;
  local_68[0] = fc->length;
  local_48 = pvVar5->up_ext;
  local_50 = fc->strand_number;
  if (pvVar5->f == (vrna_callback_hc_evaluate *)0x0) {
    uVar9 = fc->strands;
    pcVar12 = hc_default;
    pcVar14 = hc_default_sn;
  }
  else {
    local_40 = pvVar5->data;
    uVar9 = fc->strands;
    pcVar12 = hc_default_user;
    pcVar14 = hc_default_sn_user;
    local_38 = pvVar5->f;
  }
  if (uVar9 == 1) {
    pcVar14 = pcVar12;
  }
  uVar9 = vrna_get_ptype(piVar4[j] + i,ptype);
  cVar8 = (*pcVar14)(i,j,i,j,0xe,local_68);
  if (cVar8 == '\0') {
    iVar15 = 10000000;
    goto LAB_0011f5de;
  }
  if ((pvVar6->model_details).dangles == 2) {
    uVar1 = psVar3[(long)i + -1];
    uVar2 = psVar3[(long)j + 1];
    if ((short)(uVar2 | uVar1) < 0) {
      if (-1 < (short)uVar1) {
        piVar13 = pvVar6->dangle5[uVar9] + (uint)(int)(short)uVar1;
        goto LAB_0011f5a3;
      }
      if (-1 < (short)uVar2) {
        piVar13 = pvVar6->dangle3[uVar9] + (uint)(int)(short)uVar2;
        goto LAB_0011f5a3;
      }
      iVar15 = 0;
    }
    else {
      piVar13 = pvVar6->mismatchExt[uVar9][(uint)(int)(short)uVar1] + (uint)(int)(short)uVar2;
LAB_0011f5a3:
      iVar15 = *piVar13;
    }
    if (2 < uVar9) {
      iVar15 = iVar15 + pvVar6->TerminalAU;
    }
  }
  else {
    iVar15 = 0;
    if (2 < uVar9) {
      iVar15 = pvVar6->TerminalAU;
    }
  }
  if ((pvVar7 != (vrna_sc_t *)0x0) && (pvVar7->f != (vrna_callback_sc_energy *)0x0)) {
    iVar10 = (*pvVar7->f)(i,j,i,j,'\x0e',pvVar7->data);
    iVar15 = iVar15 + iVar10;
  }
LAB_0011f5de:
  if (((pvVar6->model_details).dangles & 1) != 0) {
    iVar10 = piVar4[(long)j + -1];
    cVar8 = (*pcVar14)(i,j,i,j + -1,0xe,local_68);
    if (cVar8 != '\0') {
      uVar9 = vrna_get_ptype(iVar10 + i,ptype);
      if ((long)psVar3[j] < 0) {
        iVar10 = 0;
      }
      else {
        iVar10 = pvVar6->dangle3[uVar9][psVar3[j]];
      }
      if (2 < uVar9) {
        iVar10 = iVar10 + pvVar6->TerminalAU;
      }
      if ((pvVar7 != (vrna_sc_t *)0x0) && (pvVar7->f != (vrna_callback_sc_energy *)0x0)) {
        iVar11 = (*pvVar7->f)(i,j,i,j + -1,'\x0e',pvVar7->data);
        iVar10 = iVar10 + iVar11;
      }
      if (iVar10 <= iVar15) {
        iVar15 = iVar10;
      }
    }
    iVar10 = piVar4[j];
    cVar8 = (*pcVar14)(i,j,i + 1,j,0xe,local_68);
    if (cVar8 != '\0') {
      uVar9 = vrna_get_ptype(i + iVar10 + 1,ptype);
      if ((long)psVar3[i] < 0) {
        iVar10 = 0;
      }
      else {
        iVar10 = pvVar6->dangle5[uVar9][psVar3[i]];
      }
      if (2 < uVar9) {
        iVar10 = iVar10 + pvVar6->TerminalAU;
      }
      if ((pvVar7 != (vrna_sc_t *)0x0) && (pvVar7->f != (vrna_callback_sc_energy *)0x0)) {
        iVar11 = (*pvVar7->f)(i,j,i + 1,j,'\x0e',pvVar7->data);
        iVar10 = iVar10 + iVar11;
      }
      if (iVar10 <= iVar15) {
        iVar15 = iVar10;
      }
    }
  }
  return iVar15;
}

Assistant:

PUBLIC int
vrna_E_ext_loop(vrna_fold_compound_t  *fc,
                int                   i,
                int                   j)
{
  char                      *ptype;
  short                     *S;
  unsigned int              type;
  int                       ij, en, e, *idx;
  vrna_param_t              *P;
  vrna_md_t                 *md;
  vrna_sc_t                 *sc;
  vrna_callback_hc_evaluate *evaluate;
  struct default_data       hc_dat_local;

  S         = fc->sequence_encoding;
  idx       = fc->jindx;
  ptype     = fc->ptype;
  P         = fc->params;
  md        = &(P->model_details);
  sc        = fc->sc;
  evaluate  = prepare_hc_default(fc, &hc_dat_local);

  e     = INF;
  ij    = idx[j] + i;
  type  = vrna_get_ptype(ij, ptype);

  if (evaluate(i, j, i, j, VRNA_DECOMP_EXT_STEM, &hc_dat_local)) {
    switch (md->dangles) {
      case 2:
        e = vrna_E_ext_stem(type, S[i - 1], S[j + 1], P);
        break;

      case 0:
      /* fall through */

      default:
        e = vrna_E_ext_stem(type, -1, -1, P);
        break;
    }
    if (sc)
      if (sc->f)
        e += sc->f(i, j, i, j, VRNA_DECOMP_EXT_STEM, sc->data);
  }

  if (md->dangles % 2) {
    ij = idx[j - 1] + i;
    if (evaluate(i, j, i, j - 1, VRNA_DECOMP_EXT_STEM, &hc_dat_local)) {
      type = vrna_get_ptype(ij, ptype);

      en = vrna_E_ext_stem(type, -1, S[j], P);

      if (sc)
        if (sc->f)
          en += sc->f(i, j, i, j - 1, VRNA_DECOMP_EXT_STEM, sc->data);

      e = MIN2(e, en);
    }

    ij = idx[j] + i + 1;
    if (evaluate(i, j, i + 1, j, VRNA_DECOMP_EXT_STEM, &hc_dat_local)) {
      type = vrna_get_ptype(ij, ptype);

      en = vrna_E_ext_stem(type, S[i], -1, P);

      if (sc)
        if (sc->f)
          en += sc->f(i, j, i + 1, j, VRNA_DECOMP_EXT_STEM, sc->data);

      e = MIN2(e, en);
    }
  }

  return e;
}